

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O1

void fiobj_str_clear(FIOBJ str)

{
  undefined8 uVar1;
  ulong uVar2;
  fio_str_info_s local_20;
  
  if (((uint)str & 7) == 2) {
    uVar2 = str & 0xfffffffffffffff8;
    if (*(char *)(uVar2 + 0x11) == '\0') {
      if ((((fio_str_s_conflict *)(uVar2 + 0x10))->small == '\0') && (*(long *)(uVar2 + 0x38) != 0))
      {
        if (*(long *)(uVar2 + 0x20) == 0) {
          uVar1 = 0;
          if (*(long *)(uVar2 + 0x30) == 0) {
            uVar1 = *(undefined8 *)(uVar2 + 0x28);
          }
          *(undefined8 *)(uVar2 + 0x28) = uVar1;
          fio_str_capa_assert(&local_20,(fio_str_s_conflict *)(uVar2 + 0x10),0);
        }
        *(undefined8 *)(uVar2 + 0x28) = 0;
        **(undefined1 **)(uVar2 + 0x38) = 0;
      }
      else {
        *(undefined1 *)(uVar2 + 0x10) = 1;
        *(undefined1 *)(uVar2 + 0x12) = 0;
      }
    }
    *(undefined8 *)(uVar2 + 8) = 0;
    return;
  }
  __assert_fail("FIOBJ_TYPE_IS(str, FIOBJ_T_STRING)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_str.c"
                ,0xec,"void fiobj_str_clear(FIOBJ)");
}

Assistant:

void fiobj_str_clear(FIOBJ str) {
  assert(FIOBJ_TYPE_IS(str, FIOBJ_T_STRING));
  fio_str_resize(&obj2str(str)->str, 0);
  obj2str(str)->hash = 0;
}